

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseType(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseCVQualifiers((State *)copy._40_8_);
  if ((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    bVar1 = ParseCharClass((State *)copy._40_8_,"OPRCG");
    if ((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      bVar1 = ParseTwoCharToken((State *)copy._40_8_,"Dp");
      if ((bVar1) && (bVar1 = ParseType((State *)copy._40_8_), bVar1)) {
        state_local._7_1_ = true;
      }
      else {
        memcpy((void *)copy._40_8_,local_48,0x30);
        bVar1 = ParseOneCharToken((State *)copy._40_8_,'D');
        if ((((bVar1) && (bVar1 = ParseCharClass((State *)copy._40_8_,"tT"), bVar1)) &&
            (bVar1 = ParseExpression((State *)copy._40_8_), bVar1)) &&
           (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
          state_local._7_1_ = true;
        }
        else {
          memcpy((void *)copy._40_8_,local_48,0x30);
          bVar1 = ParseOneCharToken((State *)copy._40_8_,'U');
          if (((bVar1) && (bVar1 = ParseSourceName((State *)copy._40_8_), bVar1)) &&
             (bVar1 = ParseType((State *)copy._40_8_), bVar1)) {
            state_local._7_1_ = true;
          }
          else {
            memcpy((void *)copy._40_8_,local_48,0x30);
            bVar1 = ParseBuiltinType((State *)copy._40_8_);
            if (((bVar1) || (bVar1 = ParseFunctionType((State *)copy._40_8_), bVar1)) ||
               ((bVar1 = ParseClassEnumType((State *)copy._40_8_), bVar1 ||
                (((bVar1 = ParseArrayType((State *)copy._40_8_), bVar1 ||
                  (bVar1 = ParsePointerToMemberType((State *)copy._40_8_), bVar1)) ||
                 (bVar1 = ParseSubstitution((State *)copy._40_8_), bVar1)))))) {
              state_local._7_1_ = true;
            }
            else {
              bVar1 = ParseTemplateTemplateParam((State *)copy._40_8_);
              if ((bVar1) && (bVar1 = ParseTemplateArgs((State *)copy._40_8_), bVar1)) {
                state_local._7_1_ = true;
              }
              else {
                memcpy((void *)copy._40_8_,local_48,0x30);
                bVar1 = ParseTemplateParam((State *)copy._40_8_);
                if (bVar1) {
                  state_local._7_1_ = true;
                }
                else {
                  state_local._7_1_ = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseType(State *state) {
  // We should check CV-qualifers, and PRGC things first.
  State copy = *state;
  if (ParseCVQualifiers(state) && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseCharClass(state, "OPRCG") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'U') && ParseSourceName(state) &&
      ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseBuiltinType(state) ||
      ParseFunctionType(state) ||
      ParseClassEnumType(state) ||
      ParseArrayType(state) ||
      ParsePointerToMemberType(state) ||
      ParseSubstitution(state)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  return false;
}